

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_dns_encode_record
              (mbuf *io,mg_dns_resource_record *rr,char *name,size_t nlen,void *rdata,size_t rlen)

{
  size_t sVar1;
  int iVar2;
  size_t off;
  uint32_t local_50;
  int clen;
  uint32_t u32;
  uint16_t u16;
  size_t pos;
  size_t rlen_local;
  void *rdata_local;
  size_t nlen_local;
  char *name_local;
  mg_dns_resource_record *rr_local;
  mbuf *io_local;
  
  _u32 = io->len;
  if (rr->kind == MG_DNS_INVALID_RECORD) {
    io_local._4_4_ = -1;
  }
  else {
    pos = rlen;
    rlen_local = (size_t)rdata;
    rdata_local = (void *)nlen;
    nlen_local = (size_t)name;
    name_local = (char *)rr;
    rr_local = (mg_dns_resource_record *)io;
    iVar2 = mg_dns_encode_name(io,name,nlen);
    if (iVar2 == -1) {
      io_local._4_4_ = -1;
    }
    else {
      clen._2_2_ = htons((uint16_t)*(undefined4 *)(name_local + 0x10));
      mbuf_append((mbuf *)rr_local,(void *)((long)&clen + 2),2);
      clen._2_2_ = htons((uint16_t)*(undefined4 *)(name_local + 0x14));
      mbuf_append((mbuf *)rr_local,(void *)((long)&clen + 2),2);
      if (*(int *)(name_local + 0x1c) == 2) {
        local_50 = htonl(*(uint32_t *)(name_local + 0x18));
        mbuf_append((mbuf *)rr_local,&local_50,4);
        if (*(int *)(name_local + 0x10) == 5) {
          sVar1 = (rr_local->name).len;
          mbuf_append((mbuf *)rr_local,(void *)((long)&clen + 2),2);
          iVar2 = mg_dns_encode_name((mbuf *)rr_local,(char *)rlen_local,pos);
          if (iVar2 == -1) {
            return -1;
          }
          (rr_local->name).p[sVar1] = (char)((uint)iVar2 >> 8);
          (rr_local->name).p[sVar1 + 1] = (char)iVar2;
        }
        else {
          clen._2_2_ = htons((uint16_t)pos);
          mbuf_append((mbuf *)rr_local,(void *)((long)&clen + 2),2);
          mbuf_append((mbuf *)rr_local,(void *)rlen_local,pos);
        }
      }
      io_local._4_4_ = (int)(rr_local->name).len - (int)_u32;
    }
  }
  return io_local._4_4_;
}

Assistant:

int mg_dns_encode_record(struct mbuf *io, struct mg_dns_resource_record *rr,
                         const char *name, size_t nlen, const void *rdata,
                         size_t rlen) {
    size_t pos = io->len;
    uint16_t u16;
    uint32_t u32;

    if (rr->kind == MG_DNS_INVALID_RECORD) {
        return -1; /* LCOV_EXCL_LINE */
    }

    if (mg_dns_encode_name(io, name, nlen) == -1) {
        return -1;
    }

    u16 = htons(rr->rtype);
    mbuf_append(io, &u16, 2);
    u16 = htons(rr->rclass);
    mbuf_append(io, &u16, 2);

    if (rr->kind == MG_DNS_ANSWER) {
        u32 = htonl(rr->ttl);
        mbuf_append(io, &u32, 4);

        if (rr->rtype == MG_DNS_CNAME_RECORD) {
            int clen;
            /* fill size after encoding */
            size_t off = io->len;
            mbuf_append(io, &u16, 2);
            if ((clen = mg_dns_encode_name(io, (const char *) rdata, rlen)) == -1) {
                return -1;
            }
            u16 = clen;
            io->buf[off] = u16 >> 8;
            io->buf[off + 1] = u16 & 0xff;
        } else {
            u16 = htons(rlen);
            mbuf_append(io, &u16, 2);
            mbuf_append(io, rdata, rlen);
        }
    }

    return io->len - pos;
}